

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O0

RefAST __thiscall antlr::ASTFactory::create(ASTFactory *this,int type)

{
  reference pppVar1;
  AST *pAVar2;
  uint in_EDX;
  long in_RSI;
  ASTRef *in_RDI;
  RefAST *t;
  ASTRef *this_00;
  allocator<char> local_49;
  string local_48 [8];
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  this_00 = in_RDI;
  pppVar1 = std::
            vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
            ::operator[]((vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
                          *)(in_RSI + 0x18),(long)(int)in_EDX);
  (*(*pppVar1)->second)(this_00);
  pAVar2 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  (*pAVar2->_vptr_AST[0x11])(pAVar2,(ulong)in_EDX,local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  return (RefAST)in_RDI;
}

Assistant:

RefAST ASTFactory::create(int type)
{
	RefAST t = nodeFactories[type]->second();
	t->initialize(type,"");
	return t;
}